

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

ON_XMLNode * __thiscall ON_PostEffect::XMLNode(ON_PostEffect *this)

{
  ON_XMLNode *pep_node;
  ON_PostEffect *this_local;
  
  this_local = (ON_PostEffect *)CImpl::PepNode(this->_impl);
  if ((ON_XMLNode *)this_local == (ON_XMLNode *)0x0) {
    ON_REMOVE_ASAP_AssertEx
              (0,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_post_effects.cpp"
               ,0x1a2,"","false is false");
    this_local = (ON_PostEffect *)&g_panic_node;
  }
  return (ON_XMLNode *)this_local;
}

Assistant:

ON_XMLNode& ON_PostEffect::XMLNode(void)
{
  auto* pep_node = _impl->PepNode();
  if (nullptr != pep_node)
    return *pep_node;

  // Should never get here.
  ON_ASSERT(false);
  return g_panic_node;
}